

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void codegen(FILE *outfile)

{
  _node_t *node;
  FILE *in_RDI;
  _node_t *tree;
  
  node = ast_get_tree();
  if (node != (_node_t *)0x0) {
    f = (FILE *)in_RDI;
    fprintf(in_RDI,".org $C000 ; TMP BS\n");
    syms_get_table();
    export_syms((symtbl_t *)node);
    fprintf((FILE *)f,".org $200  ; TMP BS\n");
    syms_get_table();
    export_funcs((symtbl_t *)node);
    gen_block(node);
  }
  return;
}

Assistant:

void codegen(FILE* outfile)
{
    _node_t* tree = ast_get_tree();
    if (!tree)
        return;

    f = outfile;

    fprintf(f, ".org $C000 ; TMP BS\n");
    export_syms(syms_get_table());

    fprintf(f, ".org $200  ; TMP BS\n");
    export_funcs(syms_get_table());
    gen_block(tree);
}